

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

Id __thiscall
dxil_spv::Converter::Impl::get_physical_pointer_block_type
          (Impl *this,Id base_type_id,PhysicalPointerMeta *meta)

{
  pointer *ppPVar1;
  pointer *ppuVar2;
  byte bVar3;
  uint32_t uVar4;
  PhysicalPointerEntry *pPVar5;
  iterator __position;
  Impl *pIVar6;
  uint uVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  Id IVar11;
  Id IVar12;
  Builder *pBVar13;
  Builder *pBVar14;
  uint uVar15;
  Op OVar16;
  long lVar17;
  char *pcVar18;
  __normal_iterator<dxil_spv::Converter::Impl::PhysicalPointerEntry_*,_std::vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>_>
  _Var19;
  PhysicalPointerMeta *pPVar20;
  uint __len;
  __normal_iterator<dxil_spv::Converter::Impl::PhysicalPointerEntry_*,_std::vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>_>
  __it;
  __normal_iterator<dxil_spv::Converter::Impl::PhysicalPointerEntry_*,_std::vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>_>
  __it_00;
  String type;
  PhysicalPointerEntry new_entry;
  Id local_8c;
  undefined1 local_88 [32];
  Vector<Id> local_68;
  PhysicalPointerMeta *local_40;
  Impl *local_38;
  
  local_88._8_8_ = &local_8c;
  __it._M_current =
       (this->physical_pointer_entries).
       super__Vector_base<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pPVar5 = (this->physical_pointer_entries).
           super__Vector_base<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar17 = ((long)pPVar5 - (long)__it._M_current >> 2) * -0x3333333333333333 >> 2;
  __it_00._M_current = __it._M_current;
  local_8c = base_type_id;
  local_88._0_8_ = meta;
  local_40 = meta;
  local_38 = this;
  if (0 < lVar17) {
    __it_00._M_current = __it._M_current + lVar17 * 4;
    lVar17 = lVar17 + 1;
    do {
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:768:92)>
                            *)local_88,__it);
      _Var19._M_current = __it._M_current;
      if (bVar8) goto LAB_001144dd;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:768:92)>
                            *)local_88,__it._M_current + 1);
      _Var19._M_current = __it._M_current + 1;
      if (bVar8) goto LAB_001144dd;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:768:92)>
                            *)local_88,__it._M_current + 2);
      _Var19._M_current = __it._M_current + 2;
      if (bVar8) goto LAB_001144dd;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:768:92)>
                            *)local_88,__it._M_current + 3);
      _Var19._M_current = __it._M_current + 3;
      if (bVar8) goto LAB_001144dd;
      __it._M_current = __it._M_current + 4;
      lVar17 = lVar17 + -1;
    } while (1 < lVar17);
  }
  lVar17 = ((long)pPVar5 - (long)__it_00._M_current >> 2) * -0x3333333333333333;
  if (lVar17 == 1) {
LAB_001144c7:
    bVar8 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:768:92)>
                          *)local_88,__it_00);
    _Var19._M_current = __it_00._M_current;
    if (!bVar8) {
      _Var19._M_current = pPVar5;
    }
  }
  else if (lVar17 == 2) {
LAB_001144b2:
    bVar8 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:768:92)>
                          *)local_88,__it_00);
    _Var19._M_current = __it_00._M_current;
    if (!bVar8) {
      __it_00._M_current = __it_00._M_current + 1;
      goto LAB_001144c7;
    }
  }
  else {
    _Var19._M_current = pPVar5;
    if ((lVar17 == 3) &&
       (bVar8 = __gnu_cxx::__ops::
                _Iter_pred<dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::$_0>
                ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:768:92)>
                              *)local_88,__it_00), _Var19._M_current = __it_00._M_current, !bVar8))
    {
      __it_00._M_current = __it_00._M_current + 1;
      goto LAB_001144b2;
    }
  }
LAB_001144dd:
  pIVar6 = local_38;
  if (_Var19._M_current != pPVar5) {
    return (_Var19._M_current)->ptr_type_id;
  }
  pBVar13 = SPIRVModule::get_builder(local_38->spirv_module);
  uVar9 = spv::Builder::getNumTypeConstituents(pBVar13,local_8c);
  pBVar13 = SPIRVModule::get_builder(pIVar6->spirv_module);
  iVar10 = spv::Builder::getScalarTypeWidth(pBVar13,local_8c);
  pBVar13 = SPIRVModule::get_builder(pIVar6->spirv_module);
  OVar16 = (pBVar13->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[local_8c]->opCode;
  if (OVar16 == OpTypeVector) {
    pBVar13 = SPIRVModule::get_builder(pIVar6->spirv_module);
    pBVar14 = SPIRVModule::get_builder(pIVar6->spirv_module);
    IVar11 = spv::Builder::getScalarTypeId(pBVar14,local_8c);
    OVar16 = (pBVar13->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start[IVar11]->opCode;
  }
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *)
             local_88,"PhysicalPointer","");
  pPVar20 = local_40;
  if (OVar16 == OpTypeInt) {
    if (iVar10 == 0x10) {
      pcVar18 = "Ushort";
    }
    else if (iVar10 == 0x40) {
      pcVar18 = "Uint64";
    }
    else {
      if (iVar10 != 0x20) goto LAB_00114603;
      pcVar18 = "Uint";
    }
  }
  else {
    if (OVar16 != OpTypeFloat) goto LAB_00114603;
    if (iVar10 == 0x10) {
      pcVar18 = "Half";
    }
    else if (iVar10 == 0x40) {
      pcVar18 = "Double";
    }
    else {
      if (iVar10 != 0x20) goto LAB_00114603;
      pcVar18 = "Float";
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  append((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
         local_88,pcVar18);
LAB_00114603:
  if (1 < (int)uVar9) {
    __len = 1;
    if (9 < uVar9) {
      uVar15 = uVar9;
      uVar7 = 4;
      do {
        __len = uVar7;
        if (uVar15 < 100) {
          __len = __len - 2;
          goto LAB_00114660;
        }
        if (uVar15 < 1000) {
          __len = __len - 1;
          goto LAB_00114660;
        }
        if (uVar15 < 10000) goto LAB_00114660;
        bVar8 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        uVar7 = __len + 4;
      } while (bVar8);
      __len = __len + 1;
    }
LAB_00114660:
    ppuVar2 = &local_68.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)ppuVar2;
    std::__cxx11::string::_M_construct((ulong)&local_68,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_68.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start,__len,uVar9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             local_88,(char *)local_68.
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    if ((pointer *)
        local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != ppuVar2) {
      operator_delete(local_68.
                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
  }
  if (pPVar20->nonwritable == true) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             local_88,"NonWrite");
  }
  if (pPVar20->nonreadable == true) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             local_88,"NonRead");
  }
  if (pPVar20->coherent == true) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             local_88,"Coherent");
  }
  IVar11 = local_8c;
  if (pPVar20->stride != '\0') {
    uVar4 = pPVar20->size;
    pBVar13 = SPIRVModule::get_builder(pIVar6->spirv_module);
    if (uVar4 == 0) {
      IVar11 = spv::Builder::makeRuntimeArray(pBVar13,IVar11);
      pcVar18 = "Array";
    }
    else {
      pBVar14 = SPIRVModule::get_builder(pIVar6->spirv_module);
      uVar9 = pPVar20->size;
      bVar3 = pPVar20->stride;
      IVar12 = spv::Builder::makeIntegerType(pBVar14,0x20,false);
      pPVar20 = local_40;
      IVar12 = spv::Builder::makeIntConstant(pBVar14,IVar12,uVar9 / bVar3,false);
      IVar11 = spv::Builder::makeArrayType(pBVar13,IVar11,IVar12,(uint)pPVar20->stride);
      pcVar18 = "CBVArray";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::append((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             local_88,pcVar18);
    pBVar13 = SPIRVModule::get_builder(pIVar6->spirv_module);
    spv::Builder::addDecoration(pBVar13,IVar11,DecorationArrayStride,(uint)pPVar20->stride);
  }
  pBVar13 = SPIRVModule::get_builder(pIVar6->spirv_module);
  local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)allocate_in_thread(4);
  local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start + 1;
  *local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = IVar11;
  local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  IVar11 = spv::Builder::makeStructType(pBVar13,&local_68,(char *)local_88._0_8_);
  if (local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
    free_in_thread(local_68.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  pBVar13 = SPIRVModule::get_builder(pIVar6->spirv_module);
  spv::Builder::addMemberDecoration(pBVar13,IVar11,0,DecorationOffset,0);
  pBVar13 = SPIRVModule::get_builder(pIVar6->spirv_module);
  spv::Builder::addMemberName(pBVar13,IVar11,0,"value");
  pBVar13 = SPIRVModule::get_builder(pIVar6->spirv_module);
  spv::Builder::addDecoration(pBVar13,IVar11,DecorationBlock,-1);
  if (pPVar20->nonwritable == true) {
    pBVar13 = SPIRVModule::get_builder(pIVar6->spirv_module);
    spv::Builder::addMemberDecoration(pBVar13,IVar11,0,DecorationNonWritable,-1);
  }
  if (pPVar20->nonreadable == true) {
    pBVar13 = SPIRVModule::get_builder(pIVar6->spirv_module);
    spv::Builder::addMemberDecoration(pBVar13,IVar11,0,DecorationNonReadable,-1);
  }
  if (pPVar20->coherent == true) {
    pBVar13 = SPIRVModule::get_builder(pIVar6->spirv_module);
    spv::Builder::addMemberDecoration(pBVar13,IVar11,0,DecorationCoherent,-1);
  }
  pBVar13 = SPIRVModule::get_builder(pIVar6->spirv_module);
  IVar11 = spv::Builder::makePointer(pBVar13,StorageClassPhysicalStorageBuffer,IVar11);
  local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)CONCAT44(local_8c,IVar11);
  local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44((int)((ulong)local_68.
                                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20),
                         pPVar20->size);
  local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = *(pointer *)pPVar20;
  __position._M_current =
       (pIVar6->physical_pointer_entries).
       super__Vector_base<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pIVar6->physical_pointer_entries).
      super__Vector_base<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>>
    ::_M_realloc_insert<dxil_spv::Converter::Impl::PhysicalPointerEntry_const&>
              ((vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>>
                *)&pIVar6->physical_pointer_entries,__position,(PhysicalPointerEntry *)&local_68);
  }
  else {
    ((__position._M_current)->meta).size = pPVar20->size;
    *(pointer *)__position._M_current =
         local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)&(__position._M_current)->meta =
         local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    ppPVar1 = &(pIVar6->physical_pointer_entries).
               super__Vector_base<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + 1;
  }
  if ((PhysicalPointerMeta *)local_88._0_8_ != (PhysicalPointerMeta *)(local_88 + 0x10)) {
    free_in_thread((void *)local_88._0_8_);
  }
  return IVar11;
}

Assistant:

spv::Id Converter::Impl::get_physical_pointer_block_type(spv::Id base_type_id, const PhysicalPointerMeta &meta)
{
	auto itr = std::find_if(physical_pointer_entries.begin(), physical_pointer_entries.end(), [&](const PhysicalPointerEntry &entry) {
		return entry.meta.coherent == meta.coherent &&
		       entry.meta.nonreadable == meta.nonreadable &&
		       entry.meta.nonwritable == meta.nonwritable &&
		       entry.meta.size == meta.size &&
		       entry.meta.stride == meta.stride &&
		       entry.base_type_id == base_type_id;
	});

	if (itr != physical_pointer_entries.end())
		return itr->ptr_type_id;

	int vecsize = builder().getNumTypeComponents(base_type_id);
	int width = builder().getScalarTypeWidth(base_type_id);

	spv::Op op = builder().getTypeClass(base_type_id);
	if (op == spv::OpTypeVector)
		op = builder().getTypeClass(builder().getScalarTypeId(base_type_id));

	String type = "PhysicalPointer";
	switch (op)
	{
	case spv::OpTypeFloat:
		if (width == 16)
			type += "Half";
		else if (width == 32)
			type += "Float";
		else if (width == 64)
			type += "Double";
		break;

	case spv::OpTypeInt:
		if (width == 16)
			type += "Ushort";
		else if (width == 32)
			type += "Uint";
		else if (width == 64)
			type += "Uint64";
		break;

	default:
		break;
	}

	if (vecsize > 1)
		type += std::to_string(vecsize).c_str();

	if (meta.nonwritable)
		type += "NonWrite";
	if (meta.nonreadable)
		type += "NonRead";
	if (meta.coherent)
		type += "Coherent";

	spv::Id type_id = base_type_id;

	if (meta.stride > 0)
	{
		if (meta.size == 0)
		{
			type_id = builder().makeRuntimeArray(type_id);
			type += "Array";
		}
		else
		{
			type_id = builder().makeArrayType(type_id, builder().makeUintConstant(meta.size / meta.stride),
			                                  meta.stride);
			type += "CBVArray";
		}
		builder().addDecoration(type_id, spv::DecorationArrayStride, meta.stride);
	}

	spv::Id block_type_id = builder().makeStructType({ type_id }, type.c_str());
	builder().addMemberDecoration(block_type_id, 0, spv::DecorationOffset, 0);
	builder().addMemberName(block_type_id, 0, "value");
	builder().addDecoration(block_type_id, spv::DecorationBlock);

	if (meta.nonwritable)
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationNonWritable);
	if (meta.nonreadable)
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationNonReadable);
	if (meta.coherent)
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationCoherent);

	spv::Id ptr_type_id = builder().makePointer(spv::StorageClassPhysicalStorageBuffer, block_type_id);
	PhysicalPointerEntry new_entry = {};
	new_entry.ptr_type_id = ptr_type_id;
	new_entry.base_type_id = base_type_id;
	new_entry.meta = meta;
	physical_pointer_entries.push_back(new_entry);
	return ptr_type_id;
}